

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

int setElementTypePrefix(XML_Parser parser,ELEMENT_TYPE *elementType)

{
  XML_Char XVar1;
  DTD *pDVar2;
  XML_Char *pXVar3;
  KEY pXVar4;
  XML_Bool XVar5;
  XML_Char *pXVar6;
  PREFIX *pPVar7;
  long lVar8;
  XML_Char *s;
  XML_Char *pXVar9;
  
  pDVar2 = parser->m_dtd;
  pXVar9 = elementType->name;
  lVar8 = 0;
  while( true ) {
    if (pXVar9[lVar8] == '\0') {
      return 1;
    }
    if (pXVar9[lVar8] == ':') break;
    lVar8 = lVar8 + 1;
  }
  while( true ) {
    pXVar3 = (pDVar2->pool).end;
    pXVar6 = (pDVar2->pool).ptr;
    if (lVar8 == 0) break;
    if (pXVar6 == pXVar3) {
      XVar5 = poolGrow(&pDVar2->pool);
      if (XVar5 == '\0') {
        return 0;
      }
      pXVar6 = (pDVar2->pool).ptr;
    }
    XVar1 = *pXVar9;
    (pDVar2->pool).ptr = pXVar6 + 1;
    *pXVar6 = XVar1;
    pXVar9 = pXVar9 + 1;
    lVar8 = lVar8 + -1;
  }
  if (pXVar6 == pXVar3) {
    XVar5 = poolGrow(&pDVar2->pool);
    if (XVar5 == '\0') {
      return 0;
    }
    pXVar6 = (pDVar2->pool).ptr;
  }
  (pDVar2->pool).ptr = pXVar6 + 1;
  *pXVar6 = '\0';
  pPVar7 = (PREFIX *)lookup(parser,&pDVar2->prefixes,(pDVar2->pool).start,0x10);
  if (pPVar7 != (PREFIX *)0x0) {
    pXVar4 = (pDVar2->pool).start;
    if (pPVar7->name == pXVar4) {
      (pDVar2->pool).start = (pDVar2->pool).ptr;
    }
    else {
      (pDVar2->pool).ptr = pXVar4;
    }
    elementType->prefix = pPVar7;
    return 1;
  }
  return 0;
}

Assistant:

static int
setElementTypePrefix(XML_Parser parser, ELEMENT_TYPE *elementType) {
  DTD *const dtd = parser->m_dtd; /* save one level of indirection */
  const XML_Char *name;
  for (name = elementType->name; *name; name++) {
    if (*name == XML_T(ASCII_COLON)) {
      PREFIX *prefix;
      const XML_Char *s;
      for (s = elementType->name; s != name; s++) {
        if (! poolAppendChar(&dtd->pool, *s))
          return 0;
      }
      if (! poolAppendChar(&dtd->pool, XML_T('\0')))
        return 0;
      prefix = (PREFIX *)lookup(parser, &dtd->prefixes, poolStart(&dtd->pool),
                                sizeof(PREFIX));
      if (! prefix)
        return 0;
      if (prefix->name == poolStart(&dtd->pool))
        poolFinish(&dtd->pool);
      else
        poolDiscard(&dtd->pool);
      elementType->prefix = prefix;
      break;
    }
  }
  return 1;
}